

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_optimizer.cpp
# Opt level: O1

void __thiscall glslopt_ctx::glslopt_ctx(glslopt_ctx *this,glslopt_target target)

{
  void *pvVar1;
  gl_api api;
  
  this->target = target;
  api = API_OPENGL_COMPAT;
  pvVar1 = ralloc_context((void *)0x0);
  this->mem_ctx = pvVar1;
  if (target - kGlslTargetOpenGLES20 < 3) {
    api = *(gl_api *)(&DAT_00206484 + (ulong)(target - kGlslTargetOpenGLES20) * 4);
  }
  initialize_context_to_defaults(&this->mesa_ctx,api);
  _mesa_glsl_builtin_functions_init_or_ref();
  if (target == kGlslTargetOpenGLES20) {
    (this->mesa_ctx).Extensions.OES_standard_derivatives = '\x01';
  }
  else if (target == kGlslTargetOpenGLES30) {
    (this->mesa_ctx).Extensions.ARB_ES3_1_compatibility = '\x01';
  }
  else {
    if (target != kGlslTargetMetal) {
      (this->mesa_ctx).Const.GLSLVersion = 0x96;
      goto LAB_0014f2cc;
    }
    (this->mesa_ctx).Extensions.ARB_ES3_compatibility = '\x01';
  }
  (this->mesa_ctx).Extensions.EXT_shader_framebuffer_fetch = '\x01';
LAB_0014f2cc:
  (this->mesa_ctx).Const.MaxTextureCoordUnits = 0x10;
  (this->mesa_ctx).Const.Program[0].MaxTextureImageUnits = 0x10;
  (this->mesa_ctx).Const.Program[4].MaxTextureImageUnits = 0x10;
  (this->mesa_ctx).Const.Program[3].MaxTextureImageUnits = 0x10;
  (this->mesa_ctx).Const.MaxDrawBuffers = 4;
  (this->mesa_ctx).Driver.NewProgram = new_program;
  return;
}

Assistant:

glslopt_ctx (glslopt_target target) {
		this->target = target;
		mem_ctx = ralloc_context (NULL);
		initialize_mesa_context (&mesa_ctx, target);
	}